

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * pstore::path::win32::join
                   (string *__return_storage_ptr__,string *path,
                   initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *paths)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  iterator path_00;
  long lVar5;
  char *local_118;
  string p_path;
  string result_drive;
  string p_drive;
  string result_path;
  string *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  result_drive._M_dataplus._M_p = (pointer)&result_drive.field_2;
  result_drive._M_string_length = 0;
  result_drive.field_2._M_local_buf[0] = '\0';
  result_path._M_dataplus._M_p = (pointer)&result_path.field_2;
  result_path._M_string_length = 0;
  result_path.field_2._M_local_buf[0] = '\0';
  split_drive(&local_70,path);
  p_drive._M_dataplus._M_p = (pointer)&result_path;
  p_drive._M_string_length = (size_type)&result_drive;
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&p_drive,&local_70);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_70);
  path_00 = paths->_M_array;
  lVar5 = paths->_M_len << 5;
  local_118 = "p_drive.length () == 2 && p_drive[1] == \':\'";
  do {
    if (lVar5 == 0) {
      if ((((result_path._M_string_length == 0) || (*result_path._M_dataplus._M_p == '/')) ||
          (*result_path._M_dataplus._M_p == '\\')) ||
         ((result_drive._M_string_length == 0 ||
          (result_drive._M_dataplus._M_p[result_drive._M_string_length - 1] == ':')))) {
        std::operator+(__return_storage_ptr__,&result_drive,&result_path);
      }
      else {
        std::operator+(&local_70.first,&result_drive,'\\');
        std::operator+(__return_storage_ptr__,&local_70.first,&result_path);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::~string((string *)&result_path);
      std::__cxx11::string::~string((string *)&result_drive);
      return __return_storage_ptr__;
    }
    p_drive._M_dataplus._M_p = (pointer)&p_drive.field_2;
    p_drive._M_string_length = 0;
    p_drive.field_2._M_local_buf[0] = '\0';
    p_path._M_dataplus._M_p = (pointer)&p_path.field_2;
    p_path._M_string_length = 0;
    p_path.field_2._M_local_buf[0] = '\0';
    split_drive(&local_70,path_00);
    local_80 = &p_path;
    local_78 = &p_drive;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_80,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_70);
    if ((p_path._M_string_length == 0) ||
       ((*p_path._M_dataplus._M_p != '\\' && (*p_path._M_dataplus._M_p != '/')))) {
      if ((p_drive._M_string_length != 0) &&
         (bVar2 = std::operator!=(&p_drive,&result_drive), _Var1 = result_drive._M_dataplus, bVar2))
      {
        iVar3 = 0x8c;
        if ((p_drive._M_string_length != 2) || (p_drive._M_dataplus._M_p[1] != ':')) {
LAB_00120d65:
          assert_failed(local_118,
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/path.cpp"
                        ,iVar3);
        }
        if (result_drive._M_string_length != 0) {
          iVar3 = 0x8e;
          if ((result_drive._M_string_length != 2) || (result_drive._M_dataplus._M_p[1] != ':')) {
            local_118 = 
            "result_drive.length () == 0 || (result_drive.length () == 2 && result_drive[1] == \':\')"
            ;
            goto LAB_00120d65;
          }
          iVar3 = tolower((int)*p_drive._M_dataplus._M_p);
          iVar4 = tolower((int)*_Var1._M_p);
          if (iVar3 == iVar4) {
            std::__cxx11::string::_M_assign((string *)&result_drive);
            goto LAB_00120c37;
          }
        }
        goto LAB_00120c72;
      }
LAB_00120c37:
      if (((result_path._M_string_length != 0) &&
          (result_path._M_dataplus._M_p[result_path._M_string_length - 1] != '/')) &&
         (result_path._M_dataplus._M_p[result_path._M_string_length - 1] != '\\')) {
        std::__cxx11::string::push_back((char)&result_path);
      }
      std::__cxx11::string::append((string *)&result_path);
    }
    else {
      if ((p_drive._M_string_length != 0) || (result_drive._M_string_length == 0)) {
LAB_00120c72:
        std::__cxx11::string::_M_assign((string *)&result_drive);
      }
      std::__cxx11::string::_M_assign((string *)&result_path);
    }
    std::__cxx11::string::~string((string *)&p_path);
    std::__cxx11::string::~string((string *)&p_drive);
    path_00 = path_00 + 1;
    lVar5 = lVar5 + -0x20;
  } while( true );
}

Assistant:

std::string join (std::string const & path,
                              std::initializer_list<std::string> const & paths) {
                auto is_path_sep = [] (char const c) { return c == '/' || c == '\\'; };

                std::string result_drive;
                std::string result_path;
                std::tie (result_drive, result_path) = split_drive (path);

                for (auto const & p : paths) {
                    std::string p_drive;
                    std::string p_path;
                    std::tie (p_drive, p_path) = split_drive (p);

                    if (!p_path.empty () && is_path_sep (p_path[0])) {
                        // The second path is absolute
                        if (!p_drive.empty () || result_drive.empty ()) {
                            result_drive = p_drive;
                        }

                        result_path = p_path;
                        continue;
                    }

                    if (!p_drive.empty () && p_drive != result_drive) {
                        PSTORE_ASSERT (p_drive.length () == 2 && p_drive[1] == ':');
                        PSTORE_ASSERT (result_drive.length () == 0 ||
                                       (result_drive.length () == 2 && result_drive[1] == ':'));

                        if (result_drive.length () == 0 ||
                            std::tolower (p_drive[0]) != std::tolower (result_drive[0])) {
                            // Different drives so ignore the first path entirely
                            result_drive = p_drive;
                            result_path = p_path;
                            continue;
                        }

                        // Same drive in different case
                        result_drive = p_drive;
                    }

                    // Second path is relative to the first
                    if (!result_path.empty () && !is_path_sep (result_path.back ())) {
                        result_path += '\\';
                    }
                    result_path += p_path;
                }

                // Add separator between UNC and non-absolute path
                if (!result_path.empty () && !is_path_sep (result_path[0]) &&
                    !result_drive.empty () && result_drive.back () != ':') {

                    return result_drive + '\\' + result_path;
                }

                return result_drive + result_path;
            }